

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lru-cache.h
# Opt level: O2

bool __thiscall
tstarling::
ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
::insert(ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>
         *this,ThreadSafeStringKey *key,int *value)

{
  atomic<unsigned_long> *paVar1;
  int iVar2;
  ulong uVar3;
  ListNode *pLVar4;
  spin_rw_mutex *psVar5;
  bool bVar6;
  ListNode *this_00;
  __int_type _Var7;
  bool bVar8;
  unique_lock<std::mutex> lock;
  HashMapAccessor hashAccessor;
  value_type local_50;
  
  this_00 = (ListNode *)operator_new(0x20);
  ListNode::ListNode(this_00,key);
  hashAccessor.super_const_accessor.super_scoped_type.m_mutex = (spin_rw_mutex *)0x0;
  hashAccessor.super_const_accessor.super_scoped_type.m_is_writer = false;
  hashAccessor.super_const_accessor.my_node = (node *)0x0;
  iVar2 = *value;
  std::__shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr((__shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2> *)
               &local_50,
               (__shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2> *)
               key);
  local_50.second.m_value = iVar2;
  local_50.second.m_listNode = this_00;
  bVar6 = tbb::detail::d2::
          concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
          ::insert(&this->m_map,&hashAccessor,&local_50);
  psVar5 = hashAccessor.super_const_accessor.super_scoped_type.m_mutex;
  if (bVar6) {
    if (hashAccessor.super_const_accessor.my_node != (node *)0x0) {
      hashAccessor.super_const_accessor.super_scoped_type.m_mutex = (spin_rw_mutex *)0x0;
      if (hashAccessor.super_const_accessor.super_scoped_type.m_is_writer == true) {
        LOCK();
        (psVar5->m_state).super___atomic_base<long>._M_i =
             (psVar5->m_state).super___atomic_base<long>._M_i & 0xfffffffffffffffc;
        UNLOCK();
      }
      else {
        LOCK();
        (psVar5->m_state).super___atomic_base<long>._M_i =
             (psVar5->m_state).super___atomic_base<long>._M_i + -4;
        UNLOCK();
      }
      hashAccessor.super_const_accessor.my_node = (node *)0x0;
    }
    _Var7 = (this->m_size).super___atomic_base<unsigned_long>._M_i;
    uVar3 = this->m_maxSize;
    if (uVar3 <= _Var7) {
      evict(this);
    }
    std::unique_lock<std::mutex>::unique_lock(&lock,&this->m_listMutex);
    pLVar4 = (this->m_head).m_next;
    this_00->m_prev = &this->m_head;
    this_00->m_next = pLVar4;
    pLVar4->m_prev = this_00;
    (this->m_head).m_next = this_00;
    std::unique_lock<std::mutex>::unlock(&lock);
    if (_Var7 < uVar3) {
      LOCK();
      paVar1 = &this->m_size;
      _Var7 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
    if (this->m_maxSize < _Var7) {
      LOCK();
      bVar8 = _Var7 == (this->m_size).super___atomic_base<unsigned_long>._M_i;
      if (bVar8) {
        (this->m_size).super___atomic_base<unsigned_long>._M_i = _Var7 - 1;
      }
      UNLOCK();
      if (bVar8) {
        evict(this);
      }
    }
    std::unique_lock<std::mutex>::~unique_lock(&lock);
  }
  else {
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&(this_00->m_key).m_storage.
                super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    operator_delete(this_00);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_50.first.m_storage.
              super___shared_ptr<tstarling::ThreadSafeStringKey::Storage,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  tbb::detail::d2::
  concurrent_hash_map<tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue,_tstarling::ThreadSafeStringKey::HashCompare,_tbb::detail::d1::tbb_allocator<std::pair<const_tstarling::ThreadSafeStringKey,_tstarling::ThreadSafeLRUCache<tstarling::ThreadSafeStringKey,_int,_tstarling::ThreadSafeStringKey::HashCompare>::HashMapValue>_>_>
  ::const_accessor::~const_accessor(&hashAccessor.super_const_accessor);
  return bVar6;
}

Assistant:

bool ThreadSafeLRUCache<TKey, TValue, THash>::
insert(const TKey& key, const TValue& value) {
  // Insert into the CHM
  ListNode* node = new ListNode(key);
  HashMapAccessor hashAccessor;
  HashMapValuePair hashMapValue(key, HashMapValue(value, node));
  if (!m_map.insert(hashAccessor, hashMapValue)) {
    delete node;
    return false;
  }
  hashAccessor.release();

  // Evict if necessary, now that we know the hashmap insertion was successful.
  size_t size = m_size.load();
  bool evictionDone = false;
  if (size >= m_maxSize) {
    // The container is at (or over) capacity, so eviction needs to be done.
    // Do not decrement m_size, since that would cause other threads to
    // inappropriately omit eviction during their own inserts.
    evict();
    evictionDone = true;
  }

  // Note that we have to update the LRU list before we increment m_size, so
  // that other threads don't attempt to evict list items before they even
  // exist.
  std::unique_lock<ListMutex> lock(m_listMutex);
  pushFront(node);
  lock.unlock();
  if (!evictionDone) {
    size = m_size++;
  }
  if (size > m_maxSize) {
    // It is possible for the size to temporarily exceed the maximum if there is
    // a heavy insert() load, once only as the cache fills. In this situation,
    // we have to be careful not to have every thread simultaneously attempt to
    // evict the extra entries, since we could end up underfilled. Instead we do
    // a compare-and-exchange to acquire an exclusive right to reduce the size
    // to a particular value.
    //
    // We could continue to evict in a loop, but if there are a lot of threads
    // here at the same time, that could lead to spinning. So we will just evict
    // one extra element per insert() until the overfill is rectified.
    if (m_size.compare_exchange_strong(size, size - 1)) {
      evict();
    }
  }
  return true;
}